

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Texture1D_GL.cpp
# Opt level: O3

void __thiscall
Diligent::Texture1D_GL::AttachToFramebuffer
          (Texture1D_GL *this,TextureViewDesc *ViewDesc,GLenum AttachmentPoint,
          FRAMEBUFFER_TARGET_FLAGS Targets)

{
  undefined4 in_register_0000000c;
  GLenum err;
  string msg;
  uint local_54;
  string local_50;
  
  if ((Targets & FRAMEBUFFER_TARGET_FLAG_DRAW) != FRAMEBUFFER_TARGET_FLAG_NONE) {
    if ((ViewDesc->ViewType & ~TEXTURE_VIEW_SHADER_RESOURCE) != TEXTURE_VIEW_RENDER_TARGET) {
      FormatString<char[26],char[99]>
                (&local_50,(Diligent *)"Debug expression failed:\n",
                 (char (*) [26])
                 "ViewDesc.ViewType == TEXTURE_VIEW_RENDER_TARGET || ViewDesc.ViewType == TEXTURE_VIEW_DEPTH_STENCIL"
                 ,(char (*) [99])CONCAT44(in_register_0000000c,Targets));
      DebugAssertionFailed
                (local_50._M_dataplus._M_p,"AttachToFramebuffer",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/Texture1D_GL.cpp"
                 ,0xb8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
    }
    (*__glewFramebufferTexture1D)
              (0x8ca9,AttachmentPoint,(this->super_TextureBaseGL).m_BindTarget,
               (this->super_TextureBaseGL).m_GlTexture.m_uiHandle,ViewDesc->MostDetailedMip);
    local_54 = glGetError();
    if (local_54 != 0) {
      LogError<false,char[48],char[17],unsigned_int>
                (false,"AttachToFramebuffer",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/Texture1D_GL.cpp"
                 ,0xba,(char (*) [48])"Failed to attach texture 1D to draw framebuffer",
                 (char (*) [17])"\nGL Error Code: ",&local_54);
      FormatString<char[6]>(&local_50,(char (*) [6])0x32e52e);
      DebugAssertionFailed
                (local_50._M_dataplus._M_p,"AttachToFramebuffer",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/Texture1D_GL.cpp"
                 ,0xba);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
    }
  }
  if ((Targets & FRAMEBUFFER_TARGET_FLAG_READ) != FRAMEBUFFER_TARGET_FLAG_NONE) {
    (*__glewFramebufferTexture1D)
              (0x8ca8,AttachmentPoint,(this->super_TextureBaseGL).m_BindTarget,
               (this->super_TextureBaseGL).m_GlTexture.m_uiHandle,ViewDesc->MostDetailedMip);
    local_54 = glGetError();
    if (local_54 != 0) {
      LogError<false,char[48],char[17],unsigned_int>
                (false,"AttachToFramebuffer",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/Texture1D_GL.cpp"
                 ,0xbf,(char (*) [48])"Failed to attach texture 1D to read framebuffer",
                 (char (*) [17])"\nGL Error Code: ",&local_54);
      FormatString<char[6]>(&local_50,(char (*) [6])0x32e52e);
      DebugAssertionFailed
                (local_50._M_dataplus._M_p,"AttachToFramebuffer",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/Texture1D_GL.cpp"
                 ,0xbf);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
    }
  }
  return;
}

Assistant:

void Texture1D_GL::AttachToFramebuffer(const TextureViewDesc& ViewDesc, GLenum AttachmentPoint, FRAMEBUFFER_TARGET_FLAGS Targets)
{
    // For glFramebufferTexture1D(), if texture name is not zero, then texture target must be GL_TEXTURE_1D
    if (Targets & FRAMEBUFFER_TARGET_FLAG_DRAW)
    {
        VERIFY_EXPR(ViewDesc.ViewType == TEXTURE_VIEW_RENDER_TARGET || ViewDesc.ViewType == TEXTURE_VIEW_DEPTH_STENCIL);
        glFramebufferTexture1D(GL_DRAW_FRAMEBUFFER, AttachmentPoint, m_BindTarget, m_GlTexture, ViewDesc.MostDetailedMip);
        DEV_CHECK_GL_ERROR("Failed to attach texture 1D to draw framebuffer");
    }
    if (Targets & FRAMEBUFFER_TARGET_FLAG_READ)
    {
        glFramebufferTexture1D(GL_READ_FRAMEBUFFER, AttachmentPoint, m_BindTarget, m_GlTexture, ViewDesc.MostDetailedMip);
        DEV_CHECK_GL_ERROR("Failed to attach texture 1D to read framebuffer");
    }
}